

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CheckRuleHashes(cmGlobalGenerator *this,string *pfile,string *home)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  pointer ppVar6;
  mapped_type *pmVar7;
  undefined8 local_318;
  RuleHash hash;
  string fpath;
  iterator local_2b8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
  local_2b0;
  iterator local_2a8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
  local_2a0;
  const_iterator rhi;
  undefined1 local_278 [8];
  string fname;
  string line;
  long local_228;
  ifstream fin;
  string *home_local;
  string *pfile_local;
  cmGlobalGenerator *this_local;
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_228,pcVar4,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)(fname.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_278);
    while (bVar2 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_228,(string *)((long)&fname.field_2 + 8),(bool *)0x0
                              ,-1), bVar2) {
      uVar5 = std::__cxx11::string::size();
      if ((0x21 < uVar5) &&
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)((long)&fname.field_2 + 8)),
         *pcVar4 != '#')) {
        std::__cxx11::string::substr((ulong)&rhi,(ulong)((long)&fname.field_2 + 8));
        std::__cxx11::string::operator=((string *)local_278,(string *)&rhi);
        std::__cxx11::string::~string((string *)&rhi);
        local_2a8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
             ::find(&this->RuleHashes,(key_type *)local_278);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
        ::_Rb_tree_const_iterator(&local_2a0,&local_2a8);
        local_2b8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
             ::end(&this->RuleHashes);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
        ::_Rb_tree_const_iterator(&local_2b0,&local_2b8);
        bVar2 = std::operator!=(&local_2a0,&local_2b0);
        if (bVar2) {
          pcVar4 = (char *)std::__cxx11::string::c_str();
          ppVar6 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
                   ::operator->(&local_2a0);
          iVar3 = strncmp(pcVar4,(ppVar6->second).Data,0x20);
          if (iVar3 != 0) {
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::CollapseFullPath
                      ((string *)((long)&fpath.field_2 + 8),(string *)local_278,pcVar4);
            std::__cxx11::string::operator=
                      ((string *)local_278,(string *)(fpath.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(fpath.field_2._M_local_buf + 8));
            cmsys::SystemTools::RemoveFile((string *)local_278);
          }
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmsys::SystemTools::CollapseFullPath
                    ((string *)(hash.Data + 0x18),(string *)local_278,pcVar4);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          bVar2 = cmsys::SystemTools::FileExists(pcVar4);
          if (bVar2) {
            pcVar4 = (char *)std::__cxx11::string::c_str();
            strncpy((char *)&local_318,pcVar4,0x20);
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
                     ::operator[](&this->RuleHashes,(key_type *)local_278);
            *(undefined8 *)pmVar7->Data = local_318;
            *(undefined8 *)(pmVar7->Data + 8) = hash.Data._0_8_;
            *(undefined8 *)(pmVar7->Data + 0x10) = hash.Data._8_8_;
            *(undefined8 *)(pmVar7->Data + 0x18) = hash.Data._16_8_;
          }
          std::__cxx11::string::~string((string *)(hash.Data + 0x18));
        }
      }
    }
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
  }
  std::ifstream::~ifstream(&local_228);
  return;
}

Assistant:

void cmGlobalGenerator::CheckRuleHashes(std::string const& pfile,
                                        std::string const& home)
{
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(pfile.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(pfile.c_str(), std::ios::in);
#endif
  if(!fin)
    {
    return;
    }
  std::string line;
  std::string fname;
  while(cmSystemTools::GetLineFromStream(fin, line))
    {
    // Line format is a 32-byte hex string followed by a space
    // followed by a file name (with no escaping).

    // Skip blank and comment lines.
    if(line.size() < 34 || line[0] == '#')
      {
      continue;
      }

    // Get the filename.
    fname = line.substr(33, line.npos);

    // Look for a hash for this file's rule.
    std::map<std::string, RuleHash>::const_iterator rhi =
      this->RuleHashes.find(fname);
    if(rhi != this->RuleHashes.end())
      {
      // Compare the rule hash in the file to that we were given.
      if(strncmp(line.c_str(), rhi->second.Data, 32) != 0)
        {
        // The rule has changed.  Delete the output so it will be
        // built again.
        fname = cmSystemTools::CollapseFullPath(fname, home.c_str());
        cmSystemTools::RemoveFile(fname);
        }
      }
    else
      {
      // We have no hash for a rule previously listed.  This may be a
      // case where a user has turned off a build option and might
      // want to turn it back on later, so do not delete the file.
      // Instead, we keep the rule hash as long as the file exists so
      // that if the feature is turned back on and the rule has
      // changed the file is still rebuilt.
      std::string fpath =
        cmSystemTools::CollapseFullPath(fname, home.c_str());
      if(cmSystemTools::FileExists(fpath.c_str()))
        {
        RuleHash hash;
        strncpy(hash.Data, line.c_str(), 32);
        this->RuleHashes[fname] = hash;
        }
      }
    }
}